

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O0

void VP8TBufferInit(VP8TBuffer *b,int page_size)

{
  int local_10;
  int page_size_local;
  VP8TBuffer *b_local;
  
  b->tokens = (uint16_t *)0x0;
  b->pages = (VP8Tokens *)0x0;
  b->last_page = &b->pages;
  b->left = 0;
  local_10 = page_size;
  if (page_size < 0x2000) {
    local_10 = 0x2000;
  }
  b->page_size = local_10;
  b->error = 0;
  return;
}

Assistant:

void VP8TBufferInit(VP8TBuffer* const b, int page_size) {
  b->tokens = NULL;
  b->pages = NULL;
  b->last_page = &b->pages;
  b->left = 0;
  b->page_size = (page_size < MIN_PAGE_SIZE) ? MIN_PAGE_SIZE : page_size;
  b->error = 0;
}